

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroups.cpp
# Opt level: O1

optional_idx duckdb::anon_unknown_280::GetCPUCountV1(string *cgroup_path,FileSystem *fs)

{
  pointer pcVar1;
  int iVar2;
  type pFVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer *__ptr;
  double dVar4;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  int64_t period;
  int64_t quota;
  string cfs_period;
  string cfs_quota;
  char byte_buffer [1000];
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_4e8;
  optional_idx local_4e0;
  long local_4d8;
  long local_4d0;
  string local_4c8;
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  string local_488;
  string local_468;
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  string local_428;
  undefined1 local_408 [1000];
  
  local_448[0] = local_438;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_448,"/sys/fs/cgroup/cpu%s/cpu.cfs_quota_us","");
  pcVar1 = (cgroup_path->_M_dataplus)._M_p;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar1,pcVar1 + cgroup_path->_M_string_length);
  StringUtil::Format<std::__cxx11::string>(&local_428,(StringUtil *)local_448,&local_468,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0]);
  }
  local_4a8[0] = local_498;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a8,"/sys/fs/cgroup/cpu%s/cpu.cfs_period_us","");
  pcVar1 = (cgroup_path->_M_dataplus)._M_p;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,pcVar1,pcVar1 + cgroup_path->_M_string_length);
  StringUtil::Format<std::__cxx11::string>(&local_488,(StringUtil *)local_4a8,&local_4c8,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0]);
  }
  iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,&local_428,0);
  if ((char)iVar2 != '\0') {
    iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,&local_488,0);
    if ((char)iVar2 != '\0') {
      (*fs->_vptr_FileSystem[2])(&local_4e8,fs,&local_428,1,0x100,0);
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)&local_4e8);
      iVar2 = (*fs->_vptr_FileSystem[5])(fs,pFVar3,local_408,999);
      local_408[CONCAT44(extraout_var,iVar2)] = 0;
      iVar2 = __isoc99_sscanf(local_408,"%ld",&local_4d0);
      if (iVar2 == 1) {
        if (local_4e8._M_head_impl != (FileHandle *)0x0) {
          (*(local_4e8._M_head_impl)->_vptr_FileHandle[1])();
        }
        (*fs->_vptr_FileSystem[2])(&local_4e8,fs,&local_488,1,0x100,0);
        pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                 operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                            *)&local_4e8);
        iVar2 = (*fs->_vptr_FileSystem[5])(fs,pFVar3,local_408,999);
        local_408[CONCAT44(extraout_var_00,iVar2)] = 0;
        iVar2 = __isoc99_sscanf(local_408,"%ld",&local_4d8);
        if (iVar2 == 1) {
          if (local_4e8._M_head_impl != (FileHandle *)0x0) {
            (*(local_4e8._M_head_impl)->_vptr_FileHandle[1])();
          }
          if (0 < local_4d8 && 0 < local_4d0) {
            dVar4 = ceil((double)local_4d0 / (double)local_4d8);
            optional_idx::optional_idx
                      (&local_4e0,
                       (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
            goto LAB_00e6837f;
          }
          goto LAB_00e68376;
        }
      }
      local_4e0.index = 0xffffffffffffffff;
      if (local_4e8._M_head_impl != (FileHandle *)0x0) {
        (*(local_4e8._M_head_impl)->_vptr_FileHandle[1])();
      }
      goto LAB_00e6837f;
    }
  }
LAB_00e68376:
  local_4e0.index = 0xffffffffffffffff;
LAB_00e6837f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  return (optional_idx)local_4e0.index;
}

Assistant:

static optional_idx GetCPUCountV1(const string &cgroup_path, FileSystem &fs) {
	static constexpr const char *CFS_QUOTA = "/sys/fs/cgroup/cpu%s/cpu.cfs_quota_us";
	static constexpr const char *CFS_PERIOD = "/sys/fs/cgroup/cpu%s/cpu.cfs_period_us";

	auto cfs_quota = StringUtil::Format(CFS_QUOTA, cgroup_path);
	auto cfs_period = StringUtil::Format(CFS_PERIOD, cgroup_path);

	if (!fs.FileExists(cfs_quota) || !fs.FileExists(cfs_period)) {
		return optional_idx();
	}

	//! See https://docs.kernel.org/scheduler/sched-bwc.html
	//! run-time replenished within a period (in microseconds)
	int64_t quota;
	//! the length of a period (in microseconds)
	int64_t period;

	// cgroup v1
	char byte_buffer[1000];
	{
		auto handle = fs.OpenFile(cfs_quota, FileFlags::FILE_FLAGS_READ);
		int64_t read_bytes = fs.Read(*handle, (void *)byte_buffer, 999);
		byte_buffer[read_bytes] = '\0';
		if (std::sscanf(byte_buffer, "%" SCNd64 "", &quota) != 1) {
			return optional_idx();
		}
	}
	{
		auto handle = fs.OpenFile(cfs_period, FileFlags::FILE_FLAGS_READ);
		int64_t read_bytes = fs.Read(*handle, (void *)byte_buffer, 999);
		byte_buffer[read_bytes] = '\0';
		if (std::sscanf(byte_buffer, "%" SCNd64 "", &period) != 1) {
			return optional_idx();
		}
	}

	if (quota > 0 && period > 0) {
		return idx_t(std::ceil((double)quota / (double)period));
	}
	return optional_idx();
}